

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# compressed_materialization.cpp
# Opt level: O1

void duckdb::CompressedMaterialization::GetReferencedBindings
               (Expression *expression,column_binding_set_t *referenced_bindings)

{
  BoundColumnRefExpression *pBVar1;
  __hashtable *__h;
  __node_gen_type __node_gen;
  _Any_data local_28;
  code *local_18;
  code *pcStack_10;
  
  local_28._M_unused._M_object = referenced_bindings;
  if ((expression->super_BaseExpression).type == BOUND_COLUMN_REF) {
    pBVar1 = BaseExpression::Cast<duckdb::BoundColumnRefExpression>
                       (&expression->super_BaseExpression);
    ::std::
    _Hashtable<duckdb::ColumnBinding,duckdb::ColumnBinding,std::allocator<duckdb::ColumnBinding>,std::__detail::_Identity,duckdb::ColumnBindingEquality,duckdb::ColumnBindingHashFunction,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,true,true>>
    ::
    _M_insert<duckdb::ColumnBinding_const&,std::__detail::_AllocNode<std::allocator<std::__detail::_Hash_node<duckdb::ColumnBinding,true>>>>
              ((_Hashtable<duckdb::ColumnBinding,duckdb::ColumnBinding,std::allocator<duckdb::ColumnBinding>,std::__detail::_Identity,duckdb::ColumnBindingEquality,duckdb::ColumnBindingHashFunction,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,true,true>>
                *)referenced_bindings,&pBVar1->binding);
  }
  else {
    local_28._8_8_ = 0;
    pcStack_10 = ::std::
                 _Function_handler<void_(const_duckdb::Expression_&),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/lnkuiper[P]duckdb/src/optimizer/compressed_materialization.cpp:57:19)>
                 ::_M_invoke;
    local_18 = ::std::
               _Function_handler<void_(const_duckdb::Expression_&),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/lnkuiper[P]duckdb/src/optimizer/compressed_materialization.cpp:57:19)>
               ::_M_manager;
    ExpressionIterator::EnumerateChildren
              (expression,(function<void_(const_duckdb::Expression_&)> *)&local_28);
    if (local_18 != (code *)0x0) {
      (*local_18)(&local_28,&local_28,__destroy_functor);
    }
  }
  return;
}

Assistant:

void CompressedMaterialization::GetReferencedBindings(const Expression &expression,
                                                      column_binding_set_t &referenced_bindings) {
	if (expression.GetExpressionType() == ExpressionType::BOUND_COLUMN_REF) {
		const auto &col_ref = expression.Cast<BoundColumnRefExpression>();
		referenced_bindings.insert(col_ref.binding);
	} else {
		ExpressionIterator::EnumerateChildren(
		    expression, [&](const Expression &child) { GetReferencedBindings(child, referenced_bindings); });
	}
}